

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

OrderedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedPortConnectionSyntax,slang::syntax::OrderedPortConnectionSyntax_const&>
          (BumpAllocator *this,OrderedPortConnectionSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  OrderedPortConnectionSyntax *pOVar4;
  
  pOVar4 = (OrderedPortConnectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OrderedPortConnectionSyntax *)this->endPtr < pOVar4 + 1) {
    pOVar4 = (OrderedPortConnectionSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pOVar4 + 1);
  }
  (pOVar4->super_PortConnectionSyntax).super_SyntaxNode.previewNode =
       (args->super_PortConnectionSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_PortConnectionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortConnectionSyntax).super_SyntaxNode.parent;
  (pOVar4->super_PortConnectionSyntax).super_SyntaxNode.kind =
       (args->super_PortConnectionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pOVar4->super_PortConnectionSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pOVar4->super_PortConnectionSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)
           &(args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
            field_0x4;
  pSVar1 = (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
           parent;
  (pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
       = uVar3;
  (pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       pSVar1;
  (pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
       = (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
         previewNode;
  (pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_PortConnectionSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pOVar4->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_PortConnectionSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pOVar4->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pOVar4->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c8770;
  (pOVar4->expr).ptr = (args->expr).ptr;
  return pOVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }